

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::PrimaryExpressionNode::BuildProgram
          (PrimaryExpressionNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  const_reference pvVar2;
  pointer pAVar3;
  ostream *poVar4;
  string *psVar5;
  ASTTokenBasic *local_60;
  ASTTokenBasic *local_48;
  ostream *out_local;
  Scope *scope_local;
  PrimaryExpressionNode *this_local;
  
  pvVar2 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar3 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar2);
  iVar1 = (*pAVar3->_vptr_ASTNodeBasic[2])();
  if (iVar1 == 0x2c) {
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,0);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             get(pvVar2);
    if (pAVar3 == (pointer)0x0) {
      local_60 = (ASTTokenBasic *)0x0;
    }
    else {
      local_60 = (ASTTokenBasic *)
                 __dynamic_cast(pAVar3,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
    }
    psVar5 = ASTTokenBasic::GetStr_abi_cxx11_(local_60);
    vpl::Scope::LoadVariable(scope,psVar5);
  }
  else if (iVar1 == 0x2d || iVar1 == 0x2e) {
    poVar4 = std::operator<<(out,"    push ");
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,0);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             get(pvVar2);
    if (pAVar3 == (pointer)0x0) {
      local_48 = (ASTTokenBasic *)0x0;
    }
    else {
      local_48 = (ASTTokenBasic *)
                 __dynamic_cast(pAVar3,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
    }
    psVar5 = ASTTokenBasic::GetStr_abi_cxx11_(local_48);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,'\n');
    vpl::Scope::Push(scope);
  }
  else {
    pvVar2 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,0);
    pAVar3 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar2);
    (*pAVar3->_vptr_ASTNodeBasic[5])(pAVar3,scope,out);
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                switch (children_[0]->GetType()) {
                    case kConstantType:
                    case kBoolConstantType:
                        out << "    push " << GET_TOKEN_STRING(children_[0]) << '\n';
                        scope->Push();
                        break;
                    case kIdentifierType:
                        scope->LoadVariable(GET_TOKEN_STRING(children_[0]));
                        break;
                    default:
                        children_[0]->BuildProgram(scope, out);
                        break;
                }
            }